

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-check.c
# Opt level: O2

int check_data(coda_cursor *cursor,coda_type **definition,int read_check,int size_check,
              int64_t *bit_size,_func_void_coda_cursor_ptr_char_ptr_void_ptr *callbackfunc,
              void *userdata)

{
  uint8_t uVar1;
  coda_expression *expr;
  coda_dynamic_type_struct *pcVar2;
  coda_product_struct *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  double *dst;
  int *piVar7;
  char *pcVar8;
  undefined4 *puVar9;
  size_t sVar10;
  byte *pbVar11;
  long lVar12;
  coda_type *pcVar13;
  char *pcVar14;
  undefined8 uVar15;
  long lVar16;
  byte *__size;
  ulong uVar17;
  char *local_500;
  uint8_t *local_4f8;
  int has_attributes;
  int available_definition;
  undefined4 uStack_4cc;
  coda_type_class definition_type_class;
  undefined4 uStack_4c4;
  coda_type_class type_class_1;
  undefined4 uStack_4bc;
  coda_type_class type_class;
  coda_type *type;
  long index;
  char *real_name;
  char *local_460;
  undefined8 *local_458;
  char *local_450;
  long num_fields;
  coda_native_type read_type;
  
  if (bit_size == (int64_t *)0x0) {
    __assert_fail("bit_size != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                  ,0x132,
                  "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                 );
  }
  iVar5 = coda_cursor_get_type(cursor,&type);
  if (iVar5 != 0) {
    return -1;
  }
  iVar5 = coda_type_get_class(type,&type_class);
  if (iVar5 != 0) {
    return -1;
  }
  bVar4 = true;
  if (*definition == (coda_type *)0x0) goto switchD_001231b2_caseD_4;
  iVar5 = coda_cursor_get_type_class(cursor,&type_class_1);
  if (iVar5 != 0) {
    return -1;
  }
  iVar5 = coda_type_get_class(*definition,&definition_type_class);
  if (iVar5 != 0) {
    return -1;
  }
  if (type_class_1 == definition_type_class) {
    switch(type_class_1) {
    case coda_record_class:
      pcVar13 = *definition;
      iVar5 = coda_cursor_get_type(cursor,(coda_type **)&read_type);
      if (iVar5 != 0) {
        return -1;
      }
      piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
      for (lVar12 = 0; lVar12 < (long)pcVar13[1].name; lVar12 = lVar12 + 1) {
        has_attributes = 1;
        available_definition = has_attributes;
        iVar5 = coda_cursor_get_record_field_index_from_name
                          (cursor,(char *)**(undefined8 **)(pcVar13[1].description + lVar12 * 8),
                           &index);
        if (iVar5 == 0) {
          iVar5 = coda_cursor_get_record_field_available_status
                            (cursor,CONCAT44(index._4_4_,(int)index),&has_attributes);
          if (iVar5 != 0) {
            return -1;
          }
        }
        else {
          if (*piVar7 != -0x66) {
            return -1;
          }
          *piVar7 = 0;
          has_attributes = 0;
        }
        if (*(char *)(*(long *)(pcVar13[1].description + lVar12 * 8) + 0x1c) == '\0') {
LAB_00123677:
          iVar5 = -1;
          if ((available_definition != -1) &&
             (iVar5 = available_definition, has_attributes != available_definition)) {
            pcVar14 = "available";
            pcVar8 = "available";
            if (has_attributes == 0) {
              pcVar8 = "unavailable";
            }
            if (available_definition == 0) {
              pcVar14 = "unavailable";
            }
            coda_set_error(-300,"field \'%s\' availability (%s) does not match definition (%s)",
                           **(undefined8 **)(pcVar13[1].description + lVar12 * 8),pcVar8,pcVar14);
            pcVar8 = coda_errno_to_string(*piVar7);
            (*callbackfunc)(cursor,pcVar8,userdata);
            *piVar7 = 0;
            iVar5 = available_definition;
          }
        }
        else {
          expr = *(coda_expression **)(*(long *)(pcVar13[1].description + lVar12 * 8) + 0x20);
          if (expr != (coda_expression *)0x0) {
            iVar5 = coda_expression_eval_bool(expr,cursor,&available_definition);
            if (iVar5 != 0) {
              coda_add_error_message
                        (" while evaluating definition expression for availability of field \'%s\'",
                         **(undefined8 **)(pcVar13[1].description + lVar12 * 8));
              pcVar8 = coda_errno_to_string(*piVar7);
              (*callbackfunc)(cursor,pcVar8,userdata);
              *piVar7 = 0;
            }
            goto LAB_00123677;
          }
          available_definition = -1;
          iVar5 = -1;
        }
        if ((has_attributes != 0) && (iVar5 != 0)) {
          iVar5 = coda_type_get_record_field_real_name
                            ((coda_type *)_read_type,CONCAT44(index._4_4_,(int)index),&real_name);
          if (iVar5 != 0) {
            return -1;
          }
          local_458 = *(undefined8 **)(pcVar13[1].description + lVar12 * 8);
          local_450 = (char *)local_458[1];
          if (local_450 == (char *)0x0) {
            local_450 = (char *)*local_458;
          }
          local_460 = (char *)CONCAT44(real_name._4_4_,(uint)real_name);
          iVar5 = strcmp(local_460,local_450);
          if (iVar5 != 0) {
            coda_set_error(-300,"real name for field \'%s\' (%s) does not match definition (%s)",
                           *local_458,local_460,local_450);
            pcVar8 = coda_errno_to_string(*piVar7);
            (*callbackfunc)(cursor,pcVar8,userdata);
            *piVar7 = 0;
          }
        }
      }
      iVar5 = coda_cursor_get_num_elements(cursor,&num_fields);
      if (iVar5 != 0) {
        return -1;
      }
      for (lVar12 = 0; lVar12 < num_fields; lVar12 = lVar12 + 1) {
        iVar5 = coda_type_get_record_field_name((coda_type *)_read_type,lVar12,(char **)&index);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = coda_type_get_record_field_index_from_name
                          (*definition,(char *)CONCAT44(index._4_4_,(int)index),(long *)&real_name);
        if ((iVar5 != 0) && (*piVar7 == -0x66)) {
          coda_set_error(-300,
                         "field \'%s\' availability (available) does not match definition (not allowed)"
                         ,CONCAT44(index._4_4_,(int)index));
          pcVar8 = coda_errno_to_string(*piVar7);
          (*callbackfunc)(cursor,pcVar8,userdata);
          *piVar7 = 0;
        }
      }
      break;
    case coda_array_class:
      pcVar13 = *definition;
      iVar6 = coda_cursor_get_array_dim(cursor,(int *)&index,(long *)&read_type);
      iVar5 = (int)index;
      if (iVar6 != 0) {
        return -1;
      }
      if ((int)index == *(int *)&pcVar13[1].name) {
        piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
        for (lVar12 = 0; lVar12 < iVar5; lVar12 = lVar12 + 1) {
          if ((long)(&pcVar13[1].description)[lVar12] < 0) {
            if ((coda_expression *)(&pcVar13[2].bit_size)[lVar12] != (coda_expression *)0x0) {
              iVar5 = coda_expression_eval_integer
                                ((coda_expression *)(&pcVar13[2].bit_size)[lVar12],cursor,
                                 &num_fields);
              if (iVar5 == 0) {
                if (*(undefined8 *)(&read_type + lVar12 * 2) == num_fields) goto LAB_001239c8;
                coda_set_error(-300,"size of dim[%d] (%ld) does not match definition (%ld)");
              }
              else {
                coda_add_error_message
                          (" while evaluating definition expression for dimension %d",lVar12);
              }
              pcVar8 = coda_errno_to_string(*piVar7);
              (*callbackfunc)(cursor,pcVar8,userdata);
              *piVar7 = 0;
            }
          }
          else if (*(char **)(&read_type + lVar12 * 2) != (&pcVar13[1].description)[lVar12]) {
            coda_set_error(-300,"size of dim[%d] (%ld) does not match definition (%ld)");
            pcVar8 = coda_errno_to_string(*piVar7);
            (*callbackfunc)(cursor,pcVar8,userdata);
            *piVar7 = 0;
          }
LAB_001239c8:
          iVar5 = (int)index;
        }
      }
      else {
        coda_set_error(-300,"number of dimensions (%d) does not match definition (%d)");
LAB_00123a15:
        piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
        pcVar8 = coda_errno_to_string(*piVar7);
        (*callbackfunc)(cursor,pcVar8,userdata);
        *piVar7 = 0;
      }
      break;
    case coda_integer_class:
    case coda_real_class:
      iVar5 = coda_cursor_get_read_type(cursor,&read_type);
      if (iVar5 != 0) {
        return -1;
      }
      if (read_type != (*definition)->read_type) {
        pcVar8 = coda_type_get_native_type_name(read_type);
        coda_type_get_native_type_name((*definition)->read_type);
        coda_set_error(-300,"read type (%s) does not match definition (%s)",pcVar8);
        goto LAB_00123a15;
      }
      break;
    case coda_special_class:
      iVar5 = coda_cursor_get_special_type(cursor,(coda_special_type *)&read_type);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = coda_type_get_special_type(*definition,(coda_special_type *)&num_fields);
      if (iVar5 != 0) {
        return -1;
      }
      if (read_type != (coda_special_type)num_fields) {
        local_500 = coda_type_get_special_type_name(read_type);
        coda_type_get_special_type_name((coda_special_type)num_fields);
        pcVar8 = "special type (%s) does not match definition (%s)";
        goto LAB_00123230;
      }
      goto LAB_0012327a;
    }
  }
  else {
    local_500 = coda_type_get_class_name(type_class_1);
    coda_type_get_class_name(definition_type_class);
    pcVar8 = "type (%s) does not match definition (%s)";
LAB_00123230:
    coda_set_error(-300,pcVar8,local_500);
    piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
    pcVar8 = coda_errno_to_string(*piVar7);
    (*callbackfunc)(cursor,pcVar8,userdata);
    *piVar7 = 0;
LAB_0012327a:
    *definition = (coda_type *)0x0;
  }
switchD_001231b2_caseD_4:
  if ((size_check != 0) && (type_class < (coda_special_class|coda_array_class))) {
    if ((0x3cU >> (type_class & 0x1f) & 1) == 0) {
      *bit_size = 0;
    }
    else {
      iVar5 = coda_cursor_get_bit_size(cursor,bit_size);
      if (iVar5 != 0) {
        return -1;
      }
    }
  }
  if (read_check == 0) goto switchD_001232d5_default;
  switch(type_class) {
  case coda_integer_class:
  case coda_real_class:
    break;
  case coda_text_class:
    iVar5 = coda_cursor_get_string_length(cursor,(long *)&read_type);
    if (iVar5 != 0) {
      piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
      iVar5 = *piVar7;
      if ((1 < iVar5 + 0x68U) && (iVar5 != -300)) {
        return -1;
      }
      pcVar8 = coda_errno_to_string(iVar5);
LAB_001239de:
      (*callbackfunc)(cursor,pcVar8,userdata);
      bVar4 = true;
      goto LAB_00123c65;
    }
    if ((long)_read_type < 0) {
      pcVar8 = "string length is negative";
      goto LAB_001239de;
    }
    pcVar13 = *definition;
    if (*definition == (coda_type *)0x0) {
      pcVar13 = type;
    }
    iVar5 = coda_type_get_fixed_value(pcVar13,(char **)&num_fields,&index);
    if (iVar5 != 0) {
      return -1;
    }
    if ((long)_read_type < 1) {
      local_4f8 = (uint8_t *)0x0;
    }
    else {
      __size = (byte *)((long)&_read_type->filename + 1);
      local_4f8 = (uint8_t *)malloc((size_t)__size);
      if (local_4f8 == (uint8_t *)0x0) {
        uVar15 = 0x19b;
        goto LAB_0012441f;
      }
      iVar5 = coda_cursor_read_string(cursor,(char *)local_4f8,(long)__size);
      if (iVar5 != 0) goto LAB_00124454;
    }
    if (num_fields != 0) {
      if (_read_type == (coda_product_struct *)CONCAT44(index._4_4_,(int)index)) {
        if (((long)_read_type < 1) ||
           (iVar5 = bcmp(local_4f8,(void *)num_fields,(size_t)_read_type), iVar5 == 0))
        goto LAB_00123b91;
        pcVar8 = "string data does not match fixed value";
      }
      else {
        pcVar8 = "string data does not match fixed value (length differs)";
      }
      (*callbackfunc)(cursor,pcVar8,userdata);
    }
LAB_00123b91:
    if (type[1].type_class != coda_array_class) goto switchD_00123bbe_default;
    switch((int)cursor->product[1].file_size) {
    case 0:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                    ,0x1ce,
                    "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                   );
    case 1:
      pcVar8 = "invalid end of line sequence (expected newline)";
      if (_read_type == (coda_product_struct *)0x1) {
        uVar1 = *local_4f8;
joined_r0x00123c42:
        if (uVar1 == '\n') break;
      }
      goto LAB_00123c44;
    case 2:
      pcVar8 = "invalid end of line sequence (expected carriage return)";
      if ((_read_type != (coda_product_struct *)0x1) || (*local_4f8 != '\r')) goto LAB_00123c44;
      break;
    case 3:
      pcVar8 = "invalid end of line sequence (expected carriage return followed by newline)";
      if ((_read_type == (coda_product_struct *)0x2) && (*local_4f8 == '\r')) {
        uVar1 = local_4f8[1];
        goto joined_r0x00123c42;
      }
LAB_00123c44:
      (*callbackfunc)(cursor,pcVar8,userdata);
    }
switchD_00123bbe_default:
    free(local_4f8);
switchD_001232d5_default:
    bVar4 = false;
    goto LAB_00123c65;
  case coda_raw_class:
    if ((size_check == 0) && (iVar5 = coda_cursor_get_bit_size(cursor,bit_size), iVar5 != 0))
    goto LAB_001232f7;
    uVar17 = *bit_size;
    if (-1 < (long)uVar17) {
      __size = (byte *)(((uVar17 >> 3) + 1) - (ulong)((uVar17 & 7) == 0));
      pcVar13 = *definition;
      if (*definition == (coda_type *)0x0) {
        pcVar13 = type;
      }
      iVar5 = coda_type_get_fixed_value(pcVar13,(char **)&read_type,&num_fields);
      if (iVar5 != 0) {
        return -1;
      }
      bVar4 = false;
      if (_read_type != (coda_product_struct *)0x0) {
        if (__size != (byte *)num_fields) {
          pcVar8 = "data does not match fixed value (length differs)";
          goto LAB_00123533;
        }
        if (__size != (byte *)0x0) {
          local_4f8 = (uint8_t *)malloc((size_t)__size);
          if (local_4f8 == (uint8_t *)0x0) {
            uVar15 = 0x20c;
            goto LAB_0012441f;
          }
          iVar5 = coda_cursor_read_bits(cursor,local_4f8,0,*bit_size);
          if (iVar5 != 0) goto LAB_00124454;
          iVar5 = bcmp(local_4f8,_read_type,num_fields);
          if (iVar5 != 0) {
            pcVar8 = "data does not match fixed value (value differs)";
            goto LAB_00123c44;
          }
          goto switchD_00123bbe_default;
        }
      }
      goto LAB_00123c65;
    }
    pcVar8 = "bit size is negative";
    goto LAB_00123533;
  case coda_special_class:
    bVar4 = false;
    iVar5 = coda_cursor_get_special_type(cursor,(coda_special_type *)&num_fields);
    if (iVar5 != 0) {
      return -1;
    }
    if ((coda_special_type)num_fields != 2) goto LAB_00123c65;
    break;
  default:
    goto switchD_001232d5_default;
  }
  bVar4 = false;
  iVar5 = coda_cursor_read_double(cursor,(double *)&read_type);
  if (iVar5 != 0) {
LAB_001232f7:
    piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
    iVar5 = *piVar7;
    if ((1 < iVar5 + 0x68U) && (iVar5 != -300)) {
      return -1;
    }
    pcVar8 = coda_errno_to_string(iVar5);
LAB_00123533:
    (*callbackfunc)(cursor,pcVar8,userdata);
  }
LAB_00123c65:
  iVar5 = coda_cursor_has_attributes(cursor,&has_attributes);
  if (iVar5 != 0) {
    return -1;
  }
  pcVar13 = *definition;
  if (has_attributes != 0) {
    _read_type = (coda_product_struct *)0x0;
    if ((pcVar13 != (coda_type *)0x0) &&
       (iVar5 = coda_type_get_attributes(pcVar13,(coda_type **)&read_type), iVar5 != 0)) {
      return -1;
    }
    iVar5 = coda_cursor_goto_attributes(cursor);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = check_data(cursor,(coda_type **)&read_type,read_check,0,&num_fields,callbackfunc,
                       userdata);
    if (iVar5 != 0) {
      return -1;
    }
    coda_cursor_goto_parent(cursor);
    pcVar13 = *definition;
    if ((pcVar13 != (coda_type *)0x0) && (_read_type == (coda_product_struct *)0x0)) {
      *definition = (coda_type *)0x0;
      pcVar13 = (coda_type *)0x0;
    }
  }
  if ((size_check != 0 || read_check != 0) || pcVar13 != (coda_type *)0x0) {
    if (type_class == coda_record_class) {
      memcpy(&read_type,cursor,0x310);
      iVar5 = coda_cursor_get_num_elements((coda_cursor *)&read_type,(long *)&type_class_1);
      if (iVar5 != 0) {
        return -1;
      }
      if (0 < CONCAT44(uStack_4bc,type_class_1)) {
        iVar5 = coda_cursor_goto_first_record_field(cursor);
        if (iVar5 != 0) {
          return -1;
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_001d8fb8);
        for (lVar12 = 0; lVar12 < CONCAT44(uStack_4bc,type_class_1); lVar12 = lVar12 + 1) {
          num_fields = 0;
          iVar5 = coda_cursor_get_record_field_available_status
                            ((coda_cursor *)&read_type,lVar12,&available_definition);
          if (iVar5 != 0) {
            return -1;
          }
          if (available_definition != 0) {
            if (*definition != (coda_type *)0x0) {
              iVar5 = coda_type_get_record_field_name(type,lVar12,(char **)&index);
              if (iVar5 != 0) {
                return -1;
              }
              iVar5 = coda_type_get_record_field_index_from_name
                                (*definition,(char *)CONCAT44(index._4_4_,(int)index),
                                 (long *)&real_name);
              if (iVar5 == 0) {
                iVar5 = coda_type_get_record_field_type
                                  (*definition,CONCAT44(real_name._4_4_,(uint)real_name),
                                   (coda_type **)&num_fields);
                if (iVar5 != 0) {
                  return -1;
                }
              }
              else {
                *puVar9 = 0;
              }
            }
            iVar5 = check_data(cursor,(coda_type **)&num_fields,read_check,size_check,
                               (int64_t *)&definition_type_class,callbackfunc,userdata);
            if (iVar5 != 0) {
              return -1;
            }
            if (size_check != 0) {
              *bit_size = *bit_size + CONCAT44(uStack_4c4,definition_type_class);
            }
          }
          if ((lVar12 < CONCAT44(uStack_4bc,type_class_1) + -1) &&
             (iVar5 = coda_cursor_goto_next_record_field(cursor), iVar5 != 0)) {
            return -1;
          }
        }
        coda_cursor_goto_parent(cursor);
      }
      if ((size_check != 0) && (type->size_expr != (coda_expression *)0x0)) {
        iVar5 = coda_get_option_use_fast_size_expressions();
        coda_set_option_use_fast_size_expressions(1);
        iVar6 = coda_cursor_get_bit_size(cursor,(int64_t *)&available_definition);
        if (iVar6 == 0) {
          if (*bit_size != CONCAT44(uStack_4cc,available_definition)) {
            coda_str64(*bit_size >> 3,(char *)&index);
            uVar17 = *bit_size;
            if ((uVar17 & 7) != 0) {
              sVar10 = strlen((char *)&index);
              sprintf((char *)((long)&index + sVar10),":%d",uVar17 & 7);
            }
            coda_str64(CONCAT44(uStack_4cc,available_definition) >> 3,(char *)&real_name);
            uVar17 = (ulong)(uint)available_definition;
            if ((available_definition & 7U) != 0) {
              sVar10 = strlen((char *)&real_name);
              sprintf((char *)((long)&real_name + sVar10),":%d",uVar17 & 7);
            }
            sprintf((char *)&num_fields,
                    "invalid result for record size expression (actual record size %s does not match expression result %s)"
                    ,&index,&real_name);
            (*callbackfunc)(cursor,(char *)&num_fields,userdata);
          }
        }
        else {
          piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
          pcVar8 = coda_errno_to_string(*piVar7);
          (*callbackfunc)(cursor,pcVar8,userdata);
          bVar4 = true;
        }
        coda_set_option_use_fast_size_expressions(iVar5);
      }
    }
    else if (type_class == coda_special_class) {
      _read_type = (coda_product_struct *)0x0;
      iVar5 = coda_cursor_get_special_type(cursor,(coda_special_type *)&num_fields);
      if (iVar5 != 0) {
        return -1;
      }
      if ((coda_special_type)num_fields == 0) {
        __assert_fail("special_type != coda_special_no_data",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                      ,0x346,
                      "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                     );
      }
      if ((*definition != (coda_type *)0x0) &&
         (iVar5 = coda_type_get_special_base_type(*definition,(coda_type **)&read_type), iVar5 != 0)
         ) {
        return -1;
      }
      iVar5 = coda_cursor_use_base_type_of_special_type(cursor);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = check_data(cursor,(coda_type **)&read_type,read_check,size_check,bit_size,callbackfunc
                         ,userdata);
      if (iVar5 != 0) {
        return -1;
      }
    }
    else if (type_class == coda_array_class) {
      _read_type = (coda_product_struct *)0x0;
      if ((pcVar13 != (coda_type *)0x0) &&
         (iVar5 = coda_type_get_array_base_type(pcVar13,(coda_type **)&read_type), iVar5 != 0)) {
        return -1;
      }
      iVar5 = coda_cursor_get_num_elements(cursor,&num_fields);
      if (iVar5 != 0) {
        return -1;
      }
      if (0 < num_fields) {
        iVar5 = coda_cursor_goto_first_array_element(cursor);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = coda_cursor_get_type(cursor,(coda_type **)&index);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = coda_type_get_class((coda_type *)CONCAT44(index._4_4_,(int)index),
                                    (coda_type_class *)&real_name);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = coda_type_get_format((coda_type *)CONCAT44(index._4_4_,(int)index),&type_class_1);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = coda_cursor_get_bit_size(cursor,(int64_t *)&definition_type_class);
        if (iVar5 != 0) {
          return -1;
        }
        if (((type_class_1 == coda_text_class && read_check != 0) && 1 < num_fields) &&
           (((uint)real_name & 0xfffffffe) == 2)) {
          if (size_check != 0) {
            __assert_fail("size_check == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                          ,0x297,
                          "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                         );
          }
          iVar5 = check_data(cursor,(coda_type **)&read_type,0,0,(int64_t *)&definition_type_class,
                             callbackfunc,userdata);
          if (iVar5 != 0) {
            return -1;
          }
          coda_cursor_goto_parent(cursor);
          __size = (byte *)(num_fields << 3);
          dst = (double *)malloc((size_t)__size);
          if (dst == (double *)0x0) {
            uVar15 = 0x2a5;
            goto LAB_0012441f;
          }
          iVar5 = coda_cursor_read_double_array(cursor,dst,coda_array_ordering_c);
          if (iVar5 != 0) {
            piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
            iVar5 = *piVar7;
            if ((1 < iVar5 + 0x68U) && (iVar5 != -300)) {
              return -1;
            }
            pcVar8 = coda_errno_to_string(iVar5);
            (*callbackfunc)(cursor,pcVar8,userdata);
          }
          free(dst);
        }
        else {
          for (local_500 = (char *)0x0; (long)local_500 < num_fields;
              local_500 = (char *)((long)local_500 + 1)) {
            iVar5 = check_data(cursor,(coda_type **)&read_type,read_check,size_check,
                               (int64_t *)&definition_type_class,callbackfunc,userdata);
            if (iVar5 != 0) {
              return -1;
            }
            if (size_check != 0) {
              *bit_size = *bit_size + CONCAT44(uStack_4c4,definition_type_class);
            }
            if (((long)local_500 < num_fields + -1) &&
               (iVar5 = coda_cursor_goto_next_array_element(cursor), iVar5 != 0)) {
              return -1;
            }
          }
          coda_cursor_goto_parent(cursor);
        }
        if ((*definition != (coda_type *)0x0) && (_read_type == (coda_product_struct *)0x0)) {
          *definition = (coda_type *)0x0;
        }
      }
    }
  }
  if (((bVar4 || size_check == 0) ||
      (pcVar2 = cursor->stack[(long)cursor->n + -1].type, pcVar2->backend != coda_backend_memory))
     || (pcVar2[1].backend != 2)) {
    return 0;
  }
  lVar12 = *(long *)(pcVar2 + 2);
  pcVar3 = cursor->product;
  lVar16 = *bit_size >> 3;
  uVar17 = (ulong)((uint)*bit_size & 7);
  if ((pcVar3->format != coda_format_xml) || (lVar12 <= (long)((lVar16 + 1) - (ulong)(uVar17 == 0)))
     ) {
    if ((lVar16 + 1) - (ulong)(uVar17 == 0) != lVar12) {
      coda_str64(lVar12,(char *)&num_fields);
      coda_str64(lVar16,(char *)&index);
      if (uVar17 != 0) {
        sVar10 = strlen((char *)&index);
        sprintf((char *)((long)&index + sVar10),":%d",uVar17);
      }
      sprintf((char *)&read_type,
              "incorrect block size (actual size %s does not match calculated size %s)",&num_fields,
              &index);
      (*callbackfunc)(cursor,(char *)&read_type,userdata);
      return 0;
    }
    return 0;
  }
  pcVar13 = pcVar2[2].definition;
  __size = (byte *)(lVar12 - lVar16);
  local_4f8 = (uint8_t *)malloc((size_t)(__size + 1));
  if (local_4f8 != (uint8_t *)0x0) {
    if (pcVar3->mem_ptr == (uint8_t *)0x0) {
      __assert_fail("product->format == coda_format_ascii || product->format == coda_format_binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-read-bytes.h"
                    ,100,"int read_bytes(coda_product *, int64_t, int64_t, void *)");
    }
    lVar16 = (long)&pcVar13->format + lVar16;
    if (lVar16 < 0) {
      coda_str64(lVar16,(char *)&read_type);
      coda_set_error(-0x12d,"trying to read bytes using invalid offset %s",&read_type);
    }
    else {
      if ((ulong)((long)&pcVar13->format + lVar12) <= (ulong)pcVar3->mem_size) {
        memcpy(local_4f8,pcVar3->mem_ptr + lVar16,(size_t)__size);
        local_4f8[(long)__size] = '\0';
        pbVar11 = (byte *)0x0;
        if ((long)__size < 1) {
          __size = pbVar11;
        }
        do {
          if (__size == pbVar11) {
LAB_001244be:
            free(local_4f8);
            return 0;
          }
          if ((0x20 < (ulong)local_4f8[(long)pbVar11]) ||
             ((0x100002600U >> ((ulong)local_4f8[(long)pbVar11] & 0x3f) & 1) == 0)) {
            (*callbackfunc)(cursor,"non-whitespace trailing data found for xml content",userdata);
            goto LAB_001244be;
          }
          pbVar11 = pbVar11 + 1;
        } while( true );
      }
      coda_str64((int64_t)__size,(char *)&read_type);
      coda_str64(lVar16,(char *)&num_fields);
      coda_str64(pcVar3->mem_size,(char *)&index);
      coda_set_error(-0x12d,"trying to read %s bytes at position %s in block of size %s",&read_type,
                     &num_fields,&index);
    }
LAB_00124454:
    free(local_4f8);
    return -1;
  }
  uVar15 = 0x37b;
LAB_0012441f:
  coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                 ,uVar15);
  return -1;
}

Assistant:

static int check_data(coda_cursor *cursor, coda_type **definition, int read_check, int size_check, int64_t *bit_size,
                      void (*callbackfunc)(coda_cursor *, const char *, void *), void *userdata)
{
    coda_type_class type_class;
    int skip_mem_size_check = 0;
    int has_attributes;
    coda_type *type;

    /* even if size_check==0 we need bit_size!=NULL because for some cases sizes are still calculated */
    assert(bit_size != NULL);

    if (coda_cursor_get_type(cursor, &type) != 0)
    {
        return -1;
    }
    if (coda_type_get_class(type, &type_class) != 0)
    {
        return -1;
    }

    /* check definition */
    if (check_definition(cursor, definition, callbackfunc, userdata) != 0)
    {
        return -1;
    }

    /* check bit size */
    if (size_check)
    {
        switch (type_class)
        {
            case coda_array_class:
            case coda_record_class:
            case coda_special_class:
                /* start with size=0 and have traversal below add size of sub element(s) */
                *bit_size = 0;
                break;
            case coda_integer_class:
            case coda_real_class:
            case coda_text_class:
            case coda_raw_class:
                if (coda_cursor_get_bit_size(cursor, bit_size) != 0)
                {
                    return -1;
                }
                break;
        }
    }

    /* try to read data */
    if (read_check)
    {
        switch (type_class)
        {
            case coda_array_class:
            case coda_record_class:
                break;
            case coda_integer_class:
            case coda_real_class:
                {
                    double value;

                    if (coda_cursor_read_double(cursor, &value) != 0)
                    {
                        if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                            coda_errno != CODA_ERROR_INVALID_DATETIME)
                        {
                            return -1;
                        }
                        callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                        /* just continue checking the remaining file */
                    }
                }
                break;
            case coda_text_class:
                {
                    char *data = NULL;
                    long string_length;
                    const char *fixed_value;
                    long fixed_value_length;

                    if (coda_cursor_get_string_length(cursor, &string_length) != 0)
                    {
                        if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                            coda_errno != CODA_ERROR_INVALID_DATETIME)
                        {
                            return -1;
                        }
                        callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                        /* if we can't determine the string length, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }
                    if (string_length < 0)
                    {
                        callbackfunc(cursor, "string length is negative", userdata);
                        /* if we can't determine a proper string length, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }

                    if (coda_type_get_fixed_value(*definition != NULL ? *definition : type, &fixed_value,
                                                  &fixed_value_length) != 0)
                    {
                        return -1;
                    }

                    if (string_length > 0)
                    {
                        data = (char *)malloc(string_length + 1);
                        if (data == NULL)
                        {
                            coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                           "out of memory (could not allocate %lu bytes) (%s:%u)", string_length + 1,
                                           __FILE__, __LINE__);
                            return -1;
                        }
                        if (coda_cursor_read_string(cursor, data, string_length + 1) != 0)
                        {
                            free(data);
                            return -1;
                        }
                    }

                    if (fixed_value != NULL)
                    {
                        if (string_length != fixed_value_length)
                        {
                            callbackfunc(cursor, "string data does not match fixed value (length differs)", userdata);
                            /* we do not return -1; we can just continue checking the rest of the file */
                        }
                        else if (string_length > 0)
                        {
                            if (memcmp(data, fixed_value, fixed_value_length) != 0)
                            {
                                callbackfunc(cursor, "string data does not match fixed value", userdata);
                                /* we do not return -1; we can just continue checking the rest of the file */
                            }
                        }
                    }
                    if (((coda_type_text *)type)->special_text_type == ascii_text_line_separator)
                    {
                        switch (((coda_ascii_product *)cursor->product)->end_of_line)
                        {
                            case eol_lf:
                                if (string_length != 1 || data[0] != '\n')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected newline)", userdata);
                                }
                                break;
                            case eol_cr:
                                if (string_length != 1 || data[0] != '\r')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected carriage return)",
                                                 userdata);
                                }
                                break;
                            case eol_crlf:
                                if (string_length != 2 || data[0] != '\r' || data[1] != '\n')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected carriage return "
                                                 "followed by newline)", userdata);
                                }
                                break;
                            case eol_unknown:
                                assert(0);
                                exit(1);
                        }
                    }

                    if (data != NULL)
                    {
                        free(data);
                    }
                }
                break;
            case coda_raw_class:
                {
                    int64_t byte_size;
                    const char *fixed_value;
                    long fixed_value_length;

                    if (!size_check)
                    {
                        if (coda_cursor_get_bit_size(cursor, bit_size) != 0)
                        {
                            if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                coda_errno != CODA_ERROR_INVALID_DATETIME)
                            {
                                return -1;
                            }
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            /* if we can't determine the bit size, don't try to read the data */
                            skip_mem_size_check = 1;
                            break;
                        }
                    }
                    if (*bit_size < 0)
                    {
                        callbackfunc(cursor, "bit size is negative", userdata);
                        /* if we can't determine a proper size, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }
                    byte_size = (*bit_size >> 3) + (*bit_size & 0x7 ? 1 : 0);

                    if (coda_type_get_fixed_value(*definition != NULL ? *definition : type, &fixed_value,
                                                  &fixed_value_length) != 0)
                    {
                        return -1;
                    }
                    if (fixed_value != NULL)
                    {
                        if (byte_size != fixed_value_length)
                        {
                            callbackfunc(cursor, "data does not match fixed value (length differs)", userdata);
                            /* we do not return -1; we can just continue checking the rest of the file */
                        }
                        else if (fixed_value_length > 0)
                        {
                            uint8_t *data;

                            data = (uint8_t *)malloc((size_t)byte_size);
                            if (data == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)", (long)byte_size,
                                               __FILE__, __LINE__);
                                return -1;
                            }
                            if (coda_cursor_read_bits(cursor, data, 0, *bit_size) != 0)
                            {
                                free(data);
                                return -1;
                            }
                            if (memcmp(data, fixed_value, fixed_value_length) != 0)
                            {
                                callbackfunc(cursor, "data does not match fixed value (value differs)", userdata);
                                /* we do not return -1; we can just continue checking the rest of the file */
                            }
                            free(data);
                        }
                    }
                }
                break;
            case coda_special_class:
                {
                    coda_special_type special_type;

                    if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                    {
                        return -1;
                    }

                    if (special_type == coda_special_time)
                    {
                        double value;

                        /* try to read the time value as a double */
                        if (coda_cursor_read_double(cursor, &value) != 0)
                        {
                            if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                coda_errno != CODA_ERROR_INVALID_DATETIME)
                            {
                                return -1;
                            }
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            /* just continue checking the remaining file */
                        }
                    }
                }
                break;
        }
    }

    /* check attributes */
    if (coda_cursor_has_attributes(cursor, &has_attributes) != 0)
    {
        return -1;
    }
    if (has_attributes)
    {
        coda_type *attributes_definition = NULL;
        int64_t attribute_size;

        if (*definition != NULL)
        {
            if (coda_type_get_attributes(*definition, &attributes_definition) != 0)
            {
                return -1;
            }
        }
        if (coda_cursor_goto_attributes(cursor) != 0)
        {
            return -1;
        }
        if (check_data(cursor, &attributes_definition, read_check, 0, &attribute_size, callbackfunc, userdata) != 0)
        {
            return -1;
        }
        coda_cursor_goto_parent(cursor);
        if (*definition != NULL && attributes_definition == NULL)
        {
            *definition = NULL;
        }
    }

    /* traverse sub-elements */
    if (*definition != NULL || read_check || size_check)
    {
        int64_t sub_bit_size;

        switch (type_class)
        {
            case coda_array_class:
                {
                    coda_type *base_definition = NULL;
                    long num_elements;
                    long i;

                    if (*definition != NULL)
                    {
                        if (coda_type_get_array_base_type(*definition, &base_definition) != 0)
                        {
                            return -1;
                        }
                    }
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }
                    if (num_elements > 0)
                    {
                        coda_type *array_element_type;
                        coda_type_class array_element_type_class;
                        coda_format array_element_type_format;

                        if (coda_cursor_goto_first_array_element(cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_type(cursor, &array_element_type) != 0)
                        {
                            return -1;
                        }
                        if (coda_type_get_class(array_element_type, &array_element_type_class) != 0)
                        {
                            return -1;
                        }
                        if (coda_type_get_format(array_element_type, &array_element_type_format) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(cursor, &sub_bit_size) != 0)
                        {
                            return -1;
                        }
                        /* Reading data element-by-element from a HDF5 datafile takes a long time for large datasets
                         * so for large blocks of integers or doubles in HDF5 format we check the first array element
                         * without reading it and then read the whole array in one action. */
                        if (read_check && array_element_type_format == coda_format_hdf5 && num_elements > 1 &&
                            (array_element_type_class == coda_integer_class ||
                             array_element_type_class == coda_real_class))
                        {
                            double *values;

                            assert(size_check == 0);

                            /* only perform type check for the first array element */
                            if (check_data(cursor, &base_definition, 0, 0, &sub_bit_size, callbackfunc, userdata) != 0)
                            {
                                return -1;
                            }
                            coda_cursor_goto_parent(cursor);

                            values = malloc(num_elements * sizeof(double));
                            if (values == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)",
                                               (long)(num_elements * sizeof(double)), __FILE__, __LINE__);
                                return -1;
                            }
                            if (coda_cursor_read_double_array(cursor, values, coda_array_ordering_c) != 0)
                            {
                                if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                    coda_errno != CODA_ERROR_INVALID_DATETIME)
                                {
                                    return -1;
                                }
                                callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            }
                            free(values);
                        }
                        else
                        {
                            for (i = 0; i < num_elements; i++)
                            {
                                if (check_data(cursor, &base_definition, read_check, size_check, &sub_bit_size,
                                               callbackfunc, userdata) != 0)
                                {
                                    return -1;
                                }
                                if (size_check)
                                {
                                    *bit_size += sub_bit_size;
                                }
                                if (i < num_elements - 1)
                                {
                                    if (coda_cursor_goto_next_array_element(cursor) != 0)
                                    {
                                        return -1;
                                    }
                                }
                            }
                            coda_cursor_goto_parent(cursor);
                        }
                        if (*definition != NULL && base_definition == NULL)
                        {
                            *definition = NULL;
                        }
                    }
                }
                break;
            case coda_record_class:
                {
                    coda_cursor record_cursor = *cursor;
                    long num_elements;
                    long i;

                    if (coda_cursor_get_num_elements(&record_cursor, &num_elements) != 0)
                    {
                        return -1;
                    }
                    if (num_elements > 0)
                    {
                        if (coda_cursor_goto_first_record_field(cursor) != 0)
                        {
                            return -1;
                        }
                        for (i = 0; i < num_elements; i++)
                        {
                            coda_type *field_definition = NULL;
                            int available;

                            if (coda_cursor_get_record_field_available_status(&record_cursor, i, &available) != 0)
                            {
                                return -1;
                            }
                            if (available)
                            {
                                if (*definition != NULL)
                                {
                                    const char *field_name;
                                    long index;

                                    if (coda_type_get_record_field_name(type, i, &field_name) != 0)
                                    {
                                        return -1;
                                    }
                                    if (coda_type_get_record_field_index_from_name(*definition, field_name, &index) !=
                                        0)
                                    {
                                        /* allow field to not be available in definition -> field_definition=NULL */
                                        coda_errno = 0;
                                    }
                                    else if (coda_type_get_record_field_type(*definition, index, &field_definition) !=
                                             0)
                                    {
                                        return -1;
                                    }
                                }
                                if (check_data(cursor, &field_definition, read_check, size_check, &sub_bit_size,
                                               callbackfunc, userdata) != 0)
                                {
                                    return -1;
                                }
                                if (size_check)
                                {
                                    *bit_size += sub_bit_size;
                                }
                            }
                            if (i < num_elements - 1)
                            {
                                if (coda_cursor_goto_next_record_field(cursor) != 0)
                                {
                                    return -1;
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                    if (size_check && ((coda_type_record *)type)->size_expr != NULL)
                    {
                        int64_t fast_size;
                        int prev_option_value = coda_get_option_use_fast_size_expressions();

                        coda_set_option_use_fast_size_expressions(1);
                        if (coda_cursor_get_bit_size(cursor, &fast_size) != 0)
                        {
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            skip_mem_size_check = 1;
                        }
                        else if (*bit_size != fast_size)
                        {
                            char error_message[256];
                            char s1[30];
                            char s2[30];

                            coda_str64((*bit_size) >> 3, s1);
                            if (*bit_size & 0x7)
                            {
                                sprintf(&s1[strlen(s1)], ":%d", (int)((*bit_size) & 0x7));
                            }
                            coda_str64(fast_size >> 3, s2);
                            if (fast_size & 0x7)
                            {
                                sprintf(&s2[strlen(s2)], ":%d", (int)(fast_size & 0x7));
                            }
                            sprintf(error_message, "invalid result for record size expression (actual record size %s "
                                    "does not match expression result %s)", s1, s2);
                            callbackfunc(cursor, error_message, userdata);
                        }
                        coda_set_option_use_fast_size_expressions(prev_option_value);
                    }
                }
                break;
            case coda_integer_class:
            case coda_real_class:
            case coda_text_class:
            case coda_raw_class:
                break;
            case coda_special_class:
                {
                    coda_special_type special_type;
                    coda_type *base_definition = NULL;

                    if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                    {
                        return -1;
                    }
                    assert(special_type != coda_special_no_data);

                    if (*definition != NULL)
                    {
                        if (coda_type_get_special_base_type(*definition, &base_definition) != 0)
                        {
                            return -1;
                        }
                    }
                    if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
                    {
                        return -1;
                    }
                    if (check_data(cursor, &base_definition, read_check, size_check, bit_size, callbackfunc,
                                   userdata) != 0)
                    {
                        return -1;
                    }
                }
                break;
        }
    }

    /* additional size test for mem backend */
    if (size_check && !skip_mem_size_check && cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        if (((coda_mem_type *)cursor->stack[cursor->n - 1].type)->tag == tag_mem_data)
        {
            int64_t expected_byte_size = ((coda_mem_data *)cursor->stack[cursor->n - 1].type)->length;
            int64_t calculated_bit_size = 0;

            if (bit_size != NULL)
            {
                calculated_bit_size = *bit_size;
            }
            else if (coda_cursor_get_bit_size(cursor, &calculated_bit_size) != 0)
            {
                return -1;
            }
            if (cursor->product->format == coda_format_xml &&
                bit_size_to_byte_size(calculated_bit_size) < expected_byte_size)
            {
                long offset = (long)((coda_mem_data *)cursor->stack[cursor->n - 1].type)->offset;
                int64_t byte_size = expected_byte_size - (calculated_bit_size >> 3);
                char *data;
                long i;

                /* verify that trailing data consists of only whitespace */
                data = (char *)malloc((size_t)byte_size + 1);
                if (data == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                   "out of memory (could not allocate %lu bytes) (%s:%u)", (long)byte_size,
                                   __FILE__, __LINE__);
                    return -1;
                }
                if (read_bytes(cursor->product, offset + (calculated_bit_size >> 3), byte_size, (uint8_t *)data) != 0)
                {
                    free(data);
                    return -1;
                }
                data[byte_size] = '\0';
                for (i = 0; i < byte_size; i++)
                {
                    if (data[i] != ' ' && data[i] != '\t' && data[i] != '\n' && data[i] != '\r')
                    {
                        callbackfunc(cursor, "non-whitespace trailing data found for xml content", userdata);
                        break;
                    }
                }
                free(data);
            }
            else if (bit_size_to_byte_size(calculated_bit_size) != expected_byte_size)
            {
                char error_message[256];
                char s1[30];
                char s2[30];

                coda_str64(expected_byte_size, s1);
                coda_str64(calculated_bit_size >> 3, s2);
                if (calculated_bit_size & 0x7)
                {
                    sprintf(&s2[strlen(s2)], ":%d", (int)(calculated_bit_size & 0x7));
                }
                sprintf(error_message, "incorrect block size (actual size %s does not match calculated size %s)",
                        s1, s2);
                callbackfunc(cursor, error_message, userdata);
                /* just continue checking the remaining file */
            }
        }
    }

    return 0;
}